

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority,XMLSize_t authLen)

{
  XMLCh theChar;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (authLen != 0) {
    uVar3 = 0;
    do {
      theChar = authority[uVar3];
      bVar1 = XMLString::isAlphaNum(theChar);
      lVar4 = 1;
      if (((!bVar1) && (iVar2 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar2 == -1))
         && (iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,authority[uVar3]), iVar2 == -1)
         ) {
        if (((authority[uVar3] != L'%') || (authLen <= uVar3 + 2)) ||
           (bVar1 = XMLString::isHex(authority[uVar3 + 1]), !bVar1)) {
          return false;
        }
        bVar1 = XMLString::isHex(authority[uVar3 + 2]);
        lVar4 = 3;
        if (!bVar1) {
          return false;
        }
      }
      uVar3 = uVar3 + lVar4;
    } while (uVar3 < authLen);
  }
  return true;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority,
                                           const XMLSize_t authLen)
{
    // check authority
    XMLSize_t index = 0;
    while (index < authLen)
    {
        if (isUnreservedCharacter(authority[index]) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, authority[index]) != -1))
        {
            index++;
        }
        else if (authority[index] == chPercent)               // '%'
        {
            if (index + 2 < authLen
                && XMLString::isHex(authority[index+1])       // 1st hex
                && XMLString::isHex(authority[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}